

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

CAmount wallet::TxGetCredit(CWallet *wallet,CTransaction *tx,isminefilter *filter)

{
  pointer pCVar1;
  CAmount CVar2;
  ulong uVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer txout;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  txout = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start;
  pCVar1 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (txout == pCVar1) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      CVar2 = OutputGetCredit(wallet,txout,filter);
      uVar3 = CVar2 + uVar3;
      if (2100000000000000 < uVar3) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TxGetCredit","");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_78,": value out of range");
        local_58 = (size_type *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 == paVar5) {
          local_48 = paVar5->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_58 = &local_48;
        }
        else {
          local_48 = paVar5->_M_allocated_capacity;
        }
        local_50 = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(this,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00ba135d;
      }
      txout = txout + 1;
    } while (txout != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3;
  }
LAB_00ba135d:
  __stack_chk_fail();
}

Assistant:

CAmount TxGetCredit(const CWallet& wallet, const CTransaction& tx, const isminefilter& filter)
{
    CAmount nCredit = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nCredit += OutputGetCredit(wallet, txout, filter);
        if (!MoneyRange(nCredit))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nCredit;
}